

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O0

void __thiscall
Diligent::DescriptorSetAllocator::FreeDescriptorSet::DescriptorSetDeleter::DescriptorSetDeleter
          (DescriptorSetDeleter *this,DescriptorSetDeleter *rhs)

{
  DescriptorSetDeleter *rhs_local;
  DescriptorSetDeleter *this_local;
  
  this->Allocator = rhs->Allocator;
  this->Set = rhs->Set;
  this->Pool = rhs->Pool;
  rhs->Allocator = (DescriptorSetAllocator *)0x0;
  rhs->Set = (VkDescriptorSet)0x0;
  rhs->Pool = (VkDescriptorPool)0x0;
  return;
}

Assistant:

DescriptorSetDeleter(DescriptorSetDeleter&& rhs)noexcept :
            Allocator {rhs.Allocator},
            Set       {rhs.Set      },
            Pool      {rhs.Pool     }
        {
            rhs.Allocator = nullptr;
            rhs.Set       = VK_NULL_HANDLE;
            rhs.Pool      = VK_NULL_HANDLE;
        }